

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhighdpiscaling.cpp
# Opt level: O3

qreal QHighDpiScaling::roundScaleFactor(qreal rawFactor)

{
  HighDpiScaleFactorRoundingPolicy HVar1;
  double dVar2;
  qreal qVar3;
  
  HVar1 = QGuiApplication::highDpiScaleFactorRoundingPolicy();
  dVar2 = rawFactor;
  switch(HVar1) {
  case Round:
    dVar2 = (double)((ulong)rawFactor & 0x8000000000000000 | (ulong)DAT_00674780) + rawFactor;
    break;
  case Ceil:
    goto LAB_002e167c;
  case Floor:
    dVar2 = floor(rawFactor);
    break;
  case RoundPreferFloor:
    dVar2 = floor(rawFactor);
    dVar2 = (double)(int)dVar2;
    if (rawFactor - dVar2 < 0.75) goto switchD_002e1609_default;
LAB_002e167c:
    dVar2 = ceil(rawFactor);
    break;
  default:
    goto switchD_002e1609_default;
  }
  dVar2 = (double)(int)dVar2;
switchD_002e1609_default:
  qVar3 = 1.0;
  if (1.0 <= dVar2) {
    qVar3 = dVar2;
  }
  return qVar3;
}

Assistant:

qreal QHighDpiScaling::roundScaleFactor(qreal rawFactor)
{
    // Apply scale factor rounding policy. Using mathematically correct rounding
    // may not give the most desirable visual results, especially for
    // critical fractions like .5. In general, rounding down results in visual
    // sizes that are smaller than the ideal size, and opposite for rounding up.
    // Rounding down is then preferable since "small UI" is a more acceptable
    // high-DPI experience than "large UI".

    Qt::HighDpiScaleFactorRoundingPolicy scaleFactorRoundingPolicy =
        QGuiApplication::highDpiScaleFactorRoundingPolicy();

    // Apply rounding policy.
    qreal roundedFactor = rawFactor;
    switch (scaleFactorRoundingPolicy) {
    case Qt::HighDpiScaleFactorRoundingPolicy::Round:
        roundedFactor = qRound(rawFactor);
        break;
    case Qt::HighDpiScaleFactorRoundingPolicy::Ceil:
        roundedFactor = qCeil(rawFactor);
        break;
    case Qt::HighDpiScaleFactorRoundingPolicy::Floor:
        roundedFactor = qFloor(rawFactor);
        break;
    case Qt::HighDpiScaleFactorRoundingPolicy::RoundPreferFloor:
        // Round up for .75 and higher. This favors "small UI" over "large UI".
        roundedFactor = rawFactor - qFloor(rawFactor) < 0.75
            ? qFloor(rawFactor) : qCeil(rawFactor);
        break;
    case Qt::HighDpiScaleFactorRoundingPolicy::PassThrough:
    case Qt::HighDpiScaleFactorRoundingPolicy::Unset:
        break;
    }

    // Clamp the minimum factor to 1. Qt does not currently render
    // correctly with factors less than 1.
    roundedFactor = qMax(roundedFactor, qreal(1));

    return roundedFactor;
}